

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument_pass.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::InstrumentPass::AllConstant
          (InstrumentPass *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *ids)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  int32_t iVar3;
  DefUseManager *this_00;
  Instruction *pIVar4;
  uint32_t *puVar5;
  uint *id;
  
  puVar1 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  puVar2 = (ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  do {
    puVar5 = puVar2;
    if (puVar5 == puVar1) break;
    this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
    pIVar4 = analysis::DefUseManager::GetDef(this_00,*puVar5);
    iVar3 = spvOpcodeIsConstant(pIVar4->opcode_);
    puVar2 = puVar5 + 1;
  } while (iVar3 != 0);
  return puVar5 == puVar1;
}

Assistant:

bool InstrumentPass::AllConstant(const std::vector<uint32_t>& ids) {
  for (auto& id : ids) {
    Instruction* id_inst = context()->get_def_use_mgr()->GetDef(id);
    if (!spvOpcodeIsConstant(id_inst->opcode())) return false;
  }
  return true;
}